

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_debug_helpers_generated.c
# Opt level: O3

char * mbedtls_ssl_protocol_version_str(mbedtls_ssl_protocol_version in)

{
  char *pcVar1;
  
  if (in == MBEDTLS_SSL_VERSION_UNKNOWN) {
    pcVar1 = "MBEDTLS_SSL_VERSION_UNKNOWN";
  }
  else if (in == MBEDTLS_SSL_VERSION_TLS1_3) {
    pcVar1 = "MBEDTLS_SSL_VERSION_TLS1_3";
  }
  else if (in == MBEDTLS_SSL_VERSION_TLS1_2) {
    pcVar1 = "MBEDTLS_SSL_VERSION_TLS1_2";
  }
  else {
    pcVar1 = "UNKNOWN_VALUE";
  }
  return pcVar1;
}

Assistant:

const char *mbedtls_ssl_protocol_version_str( mbedtls_ssl_protocol_version in )
{
    switch (in) {
        case MBEDTLS_SSL_VERSION_UNKNOWN:
            return "MBEDTLS_SSL_VERSION_UNKNOWN";
        case MBEDTLS_SSL_VERSION_TLS1_2:
            return "MBEDTLS_SSL_VERSION_TLS1_2";
        case MBEDTLS_SSL_VERSION_TLS1_3:
            return "MBEDTLS_SSL_VERSION_TLS1_3";
        default:
            return "UNKNOWN_VALUE";
    }
}